

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirFPOS(void)

{
  char cVar1;
  int iVar2;
  aint val;
  
  SkipBlanks(&lp);
  cVar1 = *lp;
  iVar2 = ParseExpressionNoSyntaxError(&lp,&val);
  if (iVar2 == 0) {
    Error("[FPOS] Syntax error",lp,SUPPRESS);
  }
  else if (pass == 3) {
    SeekDest((long)val,(uint)((cVar1 - 0x2bU & 0xfd) == 0));
  }
  return;
}

Assistant:

static void dirFPOS() {
	aint val;
	int method = SEEK_SET;
	SkipBlanks(lp);
	if ((*lp == '+') || (*lp == '-')) {
		method = SEEK_CUR;
	}
	if (!ParseExpressionNoSyntaxError(lp, val)) {
		Error("[FPOS] Syntax error", lp, SUPPRESS);
	} else if (pass == LASTPASS) {
		SeekDest(val, method);
	}
}